

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O3

void duckdb::RowOperations::HeapScatter
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  uint uVar4;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  byte *pbVar5;
  pointer puVar6;
  reference this_00;
  type v_00;
  NotImplementedException *this_01;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  size_type __n;
  idx_t iVar11;
  uint *puVar12;
  uint *puVar13;
  idx_t iVar14;
  ulong uVar15;
  UnifiedVectorFormat vdata_1;
  NestedValidity struct_validity;
  UnifiedVectorFormat vdata;
  optional_ptr<duckdb::NestedValidity,_true> local_40d8;
  idx_t local_40d0;
  UnifiedVectorFormat local_40c8;
  string local_4080;
  undefined1 local_4060 [40];
  undefined1 local_4038 [16];
  SelectionVector local_4028 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3ff8;
  
  bVar3 = TypeIsConstantSize((v->type).physical_type_);
  if (bVar3) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4038);
    Vector::ToUnifiedFormat(v,vcount,(UnifiedVectorFormat *)local_4038);
    HeapScatterVData((UnifiedVectorFormat *)local_4038,(v->type).physical_type_,sel,ser_count,
                     key_locations,parent_validity,offset);
  }
  else {
    PVar1 = (v->type).physical_type_;
    if (PVar1 < ARRAY) {
      if (PVar1 == LIST) {
        HeapScatterListVector(v,vcount,sel,ser_count,key_locations,parent_validity,offset);
        return;
      }
      local_40d0 = vcount;
      if (PVar1 != STRUCT) {
LAB_00acdd5a:
        this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_4038._0_8_ = local_4028;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4038,"Serialization of variable length vector with type %s","");
        LogicalType::ToString_abi_cxx11_(&local_4080,&v->type);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_01,(string *)local_4038,&local_4080);
        __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      local_40d8.ptr = parent_validity.ptr;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_40c8);
      Vector::ToUnifiedFormat(v,local_40d0,&local_40c8);
      this = StructVector::GetEntries(v);
      puVar6 = (this->
               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (this->
                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ser_count != 0) {
        uVar9 = ((long)puVar10 - (long)puVar6 >> 3) + 7U >> 3;
        uVar15 = 0;
        do {
          pdVar2 = key_locations[uVar15];
          *(data_ptr_t *)(local_4038 + uVar15 * 8) = pdVar2;
          switchD_005681f0::default(pdVar2,0xff,uVar9);
          key_locations[uVar15] = key_locations[uVar15] + uVar9;
          uVar8 = uVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)sel->sel_vector[uVar15];
          }
          if ((local_40c8.sel)->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)*(uint *)((long)(local_40c8.sel)->sel_vector + uVar8 * 4);
          }
          if (((local_40d8.ptr != (NestedValidity *)0x0) &&
              (local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
               (unsigned_long *)0x0)) &&
             ((local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar8 + offset >> 6] >> (uVar8 + offset & 0x3f) & 1) == 0)) {
            optional_ptr<duckdb::NestedValidity,_true>::CheckValid(&local_40d8);
            if ((local_40d8.ptr)->list_validity_location == (data_ptr_t)0x0) {
              bVar7 = (byte)(local_40d8.ptr)->idx_in_entry;
              pbVar5 = (local_40d8.ptr)->struct_validity_locations[uVar15] +
                       (local_40d8.ptr)->entry_idx;
            }
            else {
              uVar8 = (local_40d8.ptr)->list_validity_offset + uVar15;
              bVar7 = (byte)uVar8 & 7;
              pbVar5 = (local_40d8.ptr)->list_validity_location + (uVar8 >> 3);
            }
            *pbVar5 = *pbVar5 & ~(byte)(1L << (bVar7 & 0x3f));
          }
          uVar15 = uVar15 + 1;
        } while (ser_count != uVar15);
        puVar6 = (this->
                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = (this->
                  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (puVar10 != puVar6) {
        __n = 0;
        do {
          this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this,__n);
          v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (this_00);
          NestedValidity::NestedValidity((NestedValidity *)local_4060,(data_ptr_t *)local_4038,__n);
          HeapScatter(v_00,local_40d0,sel,ser_count,key_locations,(NestedValidity *)local_4060,
                      offset);
          __n = __n + 1;
        } while (__n < (ulong)((long)(this->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_40c8.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40c8.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      goto LAB_00acd93a;
    }
    if (PVar1 == ARRAY) {
      HeapScatterArrayVector(v,vcount,sel,ser_count,key_locations,parent_validity,offset);
      return;
    }
    if (PVar1 != VARCHAR) goto LAB_00acdd5a;
    local_40c8.sel = (SelectionVector *)parent_validity.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4038);
    Vector::ToUnifiedFormat(v,vcount,(UnifiedVectorFormat *)local_4038);
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar14 = 0;
        do {
          iVar11 = iVar14;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar11 = (idx_t)sel->sel_vector[iVar14];
          }
          uVar9 = iVar11 + offset;
          if (*(long *)local_4038._0_8_ != 0) {
            uVar9 = (ulong)*(uint *)(*(long *)local_4038._0_8_ + uVar9 * 4);
          }
          if (((unsigned_long *)local_4028[0].sel_vector == (unsigned_long *)0x0) ||
             ((*(ulong *)((long)local_4028[0].sel_vector + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1)
              != 0)) {
            uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                              ((ulong)*(uint *)(local_4038._8_8_ + uVar9 * 0x10));
            puVar12 = (uint *)(local_4038._8_8_ + uVar9 * 0x10);
            *(uint *)key_locations[iVar14] = uVar4;
            pdVar2 = key_locations[iVar14];
            key_locations[iVar14] = pdVar2 + 4;
            if ((ulong)*puVar12 < 0xd) {
              puVar13 = puVar12 + 1;
            }
            else {
              puVar13 = *(uint **)(puVar12 + 2);
            }
            switchD_00b03519::default(pdVar2 + 4,puVar13,(ulong)*puVar12);
            key_locations[iVar14] = key_locations[iVar14] + *puVar12;
          }
          iVar14 = iVar14 + 1;
        } while (ser_count != iVar14);
      }
    }
    else if (ser_count != 0) {
      iVar14 = 0;
      do {
        iVar11 = iVar14;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar14];
        }
        uVar9 = iVar11 + offset;
        if (*(long *)local_4038._0_8_ != 0) {
          uVar9 = (ulong)*(uint *)(*(long *)local_4038._0_8_ + uVar9 * 4);
        }
        if (((unsigned_long *)local_4028[0].sel_vector == (unsigned_long *)0x0) ||
           ((*(ulong *)((long)local_4028[0].sel_vector + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) !=
            0)) {
          uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                            ((ulong)*(uint *)(local_4038._8_8_ + uVar9 * 0x10));
          puVar12 = (uint *)(local_4038._8_8_ + uVar9 * 0x10);
          *(uint *)key_locations[iVar14] = uVar4;
          pdVar2 = key_locations[iVar14];
          key_locations[iVar14] = pdVar2 + 4;
          if ((ulong)*puVar12 < 0xd) {
            puVar13 = puVar12 + 1;
          }
          else {
            puVar13 = *(uint **)(puVar12 + 2);
          }
          switchD_00b03519::default(pdVar2 + 4,puVar13,(ulong)*puVar12);
          key_locations[iVar14] = key_locations[iVar14] + *puVar12;
        }
        else {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_40c8);
          if ((local_40c8.sel)->sel_vector == (sel_t *)0x0) {
            bVar7 = (byte)*(idx_t *)((long)local_40c8.sel + 0x18);
            pbVar5 = (*(data_ptr_t **)&(local_40c8.sel)->selection_data)[iVar14] +
                     *(idx_t *)((long)local_40c8.sel + 0x10);
          }
          else {
            uVar9 = *(idx_t *)((long)local_40c8.sel + 0x20) + iVar14;
            bVar7 = (byte)uVar9 & 7;
            pbVar5 = (byte *)((long)(local_40c8.sel)->sel_vector + (uVar9 >> 3));
          }
          *pbVar5 = *pbVar5 & ~(byte)(1L << (bVar7 & 0x3f));
        }
        iVar14 = iVar14 + 1;
      } while (ser_count != iVar14);
    }
  }
  local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_4028[0].selection_data.internal.
       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_3ff8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3ff8._M_pi);
    local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_4028[0].selection_data.internal.
         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
LAB_00acd93a:
  if (local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void RowOperations::HeapScatter(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity, idx_t offset) {
	if (TypeIsConstantSize(v.GetType().InternalType())) {
		UnifiedVectorFormat vdata;
		v.ToUnifiedFormat(vcount, vdata);
		RowOperations::HeapScatterVData(vdata, v.GetType().InternalType(), sel, ser_count, key_locations,
		                                parent_validity, offset);
	} else {
		switch (v.GetType().InternalType()) {
		case PhysicalType::VARCHAR:
			HeapScatterStringVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::STRUCT:
			HeapScatterStructVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::LIST:
			HeapScatterListVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::ARRAY:
			HeapScatterArrayVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		default:
			// LCOV_EXCL_START
			throw NotImplementedException("Serialization of variable length vector with type %s",
			                              v.GetType().ToString());
			// LCOV_EXCL_STOP
		}
	}
}